

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_memoryDumpOutput_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_memoryDumpOutput_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_memoryDumpOutput_Test *this_00;
  TEST_MemoryLeakDetectorTest_memoryDumpOutput_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_memoryDumpOutput_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0xa3);
  TEST_MemoryLeakDetectorTest_memoryDumpOutput_Test::
  TEST_MemoryLeakDetectorTest_memoryDumpOutput_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, memoryDumpOutput)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 6);
    SimpleString::StrNCpy(mem, "test1", 6);
    SimpleString output = detector->report(mem_leak_period_checking);

    STRCMP_CONTAINS("Alloc num (1)", output.asCharString());
    STRCMP_CONTAINS("Leak size: 6 Allocated at",  output.asCharString());
    STRCMP_CONTAINS("Content:",  output.asCharString());
    STRCMP_CONTAINS("0000: 74 65 73 74 31 00                                |test1.|", output.asCharString());

    PlatformSpecificFree(mem);
}